

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O1

void __thiscall
libtorrent::torrent_info::add_tracker(torrent_info *this,string *url,int tier,tracker_source source)

{
  announce_entry *paVar1;
  pointer paVar2;
  pointer paVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  __normal_iterator<libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
  _Var7;
  __normal_iterator<libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
  __it;
  __normal_iterator<libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
  __it_00;
  __normal_iterator<libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
  __i;
  pointer paVar8;
  string_view u;
  announce_entry e;
  announce_entry local_90;
  
  __it._M_current =
       (this->m_urls).
       super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
       .
       super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  paVar1 = (this->m_urls).
           super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           .
           super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = ((long)paVar1 - (long)__it._M_current >> 5) * -0x5555555555555555 >> 2;
  __it_00._M_current = __it._M_current;
  local_90.url._M_dataplus._M_p = (pointer)url;
  if (0 < lVar6) {
    __it_00._M_current = __it._M_current + lVar6 * 4;
    lVar6 = lVar6 + 1;
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::$_0>
              ::operator()((_Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__0>
                            *)&local_90,__it);
      _Var7._M_current = __it._M_current;
      if (bVar4) goto LAB_003771d7;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::$_0>
              ::operator()((_Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__0>
                            *)&local_90,__it._M_current + 1);
      _Var7._M_current = __it._M_current + 1;
      if (bVar4) goto LAB_003771d7;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::$_0>
              ::operator()((_Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__0>
                            *)&local_90,__it._M_current + 2);
      _Var7._M_current = __it._M_current + 2;
      if (bVar4) goto LAB_003771d7;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::$_0>
              ::operator()((_Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__0>
                            *)&local_90,__it._M_current + 3);
      _Var7._M_current = __it._M_current + 3;
      if (bVar4) goto LAB_003771d7;
      __it._M_current = __it._M_current + 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  lVar6 = ((long)paVar1 - (long)__it_00._M_current >> 5) * -0x5555555555555555;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      _Var7._M_current = paVar1;
      if ((lVar6 != 3) ||
         (bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::$_0>
                  ::operator()((_Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__0>
                                *)&local_90,__it_00), _Var7._M_current = __it_00._M_current, bVar4))
      goto LAB_003771d7;
      __it_00._M_current = __it_00._M_current + 1;
    }
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::$_0>
            ::operator()((_Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__0>
                          *)&local_90,__it_00);
    _Var7._M_current = __it_00._M_current;
    if (bVar4) goto LAB_003771d7;
    __it_00._M_current = __it_00._M_current + 1;
  }
  bVar4 = __gnu_cxx::__ops::
          _Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::$_0>
          ::operator()((_Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__0>
                        *)&local_90,__it_00);
  _Var7._M_current = __it_00._M_current;
  if (!bVar4) {
    _Var7._M_current = paVar1;
  }
LAB_003771d7:
  if (_Var7._M_current == paVar1) {
    u._M_str = (url->_M_dataplus)._M_p;
    u._M_len = url->_M_string_length;
    v1_2::announce_entry::announce_entry(&local_90,u);
    local_90.tier = (uint8_t)tier;
    local_90._90_1_ = local_90._90_1_ & 0xf0 | (byte)source & 0xf;
    ::std::
    vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>::
    push_back(&(this->m_urls).
               super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
              ,&local_90);
    paVar2 = (this->m_urls).
             super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             .
             super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    paVar3 = (this->m_urls).
             super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             .
             super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (paVar2 != paVar3) {
      uVar5 = ((long)paVar3 - (long)paVar2 >> 5) * -0x5555555555555555;
      lVar6 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry*,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__1>>
                (paVar2,paVar3,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)paVar3 - (long)paVar2 < 0x601) {
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry*,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__1>>
                  (paVar2,paVar3);
      }
      else {
        paVar8 = paVar2 + 0x10;
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry*,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__1>>
                  (paVar2,paVar8);
        for (; paVar8 != paVar3; paVar8 = paVar8 + 1) {
          ::std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry*,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>,__gnu_cxx::__ops::_Val_comp_iter<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__1>>
                    (paVar8);
        }
      }
    }
    v1_2::announce_entry::~announce_entry(&local_90);
  }
  return;
}

Assistant:

void torrent_info::add_tracker(std::string const& url, int const tier
		, announce_entry::tracker_source const source)
	{
		TORRENT_ASSERT_PRECOND(!url.empty());
		auto const i = std::find_if(m_urls.begin(), m_urls.end()
			, [&url](announce_entry const& ae) { return ae.url == url; });
		if (i != m_urls.end()) return;

		announce_entry e(url);
		e.tier = std::uint8_t(tier);
		e.source = source;
		m_urls.push_back(e);

		std::sort(m_urls.begin(), m_urls.end()
			, [] (announce_entry const& lhs, announce_entry const& rhs)
			{ return lhs.tier < rhs.tier; });
	}